

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O1

void __thiscall Solver::constructSolutionSteps(Solver *this,Board *board)

{
  vector<Board,_std::allocator<Board>_> *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *this_01;
  pointer pcVar1;
  _Base_ptr p_Var2;
  int iVar3;
  mapped_type *__x;
  string lastReference;
  key_type local_50;
  
  pcVar1 = (board->referrer)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (board->referrer)._M_string_length);
  this_00 = &this->steps;
  std::vector<Board,_std::allocator<Board>_>::push_back(this_00,board);
  this_01 = &this->pastSteps;
  while( true ) {
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) break;
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
          ::operator[](this_01,&local_50);
    std::vector<Board,_std::allocator<Board>_>::push_back(this_00,__x);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
    ::operator[](this_01,&local_50);
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  p_Var2 = (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this->numberOfNodes = (this->pastSteps)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<Board,_std::allocator<Board>_>::push_back(this_00,(value_type *)(p_Var2 + 2));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  ::clear(&this_01->_M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Solver::constructSolutionSteps(Board board) {

    // Process the solution board first.
    string lastReference = board.referrer;
    this->steps.push_back(board);

    // Construct the solution steps from the reference chain.
    while (lastReference != "") {
        this->steps.push_back(this->pastSteps[lastReference]);
        lastReference = this->pastSteps[lastReference].referrer;
    }

    // Get the number of steps taken to find the solution.
    this->numberOfNodes = this->pastSteps.size();

    // Push the initial state of the board to the vector.
    this->steps.push_back((this->pastSteps.begin())->second);

    // Remove the useless past steps.
    this->pastSteps.clear();

    return;
}